

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kyber.cc
# Opt level: O0

int kyber_parse_public_key_no_hash(public_key *pub,CBS *in)

{
  int iVar1;
  uint8_t *in_00;
  undefined1 local_30 [8];
  CBS t_bytes;
  CBS *in_local;
  public_key *pub_local;
  
  t_bytes.len = (size_t)in;
  iVar1 = CBS_get_bytes(in,(CBS *)local_30,0x480);
  if (iVar1 != 0) {
    in_00 = CBS_data((CBS *)local_30);
    iVar1 = vector_decode(&pub->t,in_00,0xc);
    if ((iVar1 != 0) && (iVar1 = CBS_copy_bytes((CBS *)t_bytes.len,pub->rho,0x20), iVar1 != 0)) {
      matrix_expand(&pub->m,pub->rho);
      return 1;
    }
  }
  return 0;
}

Assistant:

static int kyber_parse_public_key_no_hash(struct public_key *pub, CBS *in) {
  CBS t_bytes;
  if (!CBS_get_bytes(in, &t_bytes, kEncodedVectorSize) ||
      !vector_decode(&pub->t, CBS_data(&t_bytes), kLog2Prime) ||
      !CBS_copy_bytes(in, pub->rho, sizeof(pub->rho))) {
    return 0;
  }
  matrix_expand(&pub->m, pub->rho);
  return 1;
}